

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O2

void do_animation(void)

{
  uint32_t *puVar1;
  uint8_t selection_attr;
  _Bool _Var2;
  uint8_t uVar3;
  wchar_t wVar4;
  uint32_t uVar5;
  monster *mon;
  wchar_t idx;
  
  idx = L'\x01';
  do {
    wVar4 = cave_monster_max(cave);
    if (wVar4 <= idx) {
      flicker = flicker + '\x01';
      return;
    }
    mon = cave_monster(cave,idx);
    if (((mon != (monster *)0x0) && (mon->race != (monster_race *)0x0)) &&
       (_Var2 = monster_is_visible(mon), _Var2)) {
      _Var2 = flag_has_dbg(mon->race->flags,0xb,10,"mon->race->flags","RF_ATTR_MULTI");
      if (_Var2) {
        uVar5 = Rand_div(0x1c);
        uVar3 = (char)uVar5 + '\x01';
      }
      else {
        _Var2 = flag_has_dbg(mon->race->flags,0xb,0xb,"mon->race->flags","RF_ATTR_FLICKER");
        if (!_Var2) goto LAB_001b5224;
        selection_attr = monster_x_attr[mon->race->ridx];
        uVar3 = visuals_cycler_get_attr_for_race(mon->race,(ulong)flicker);
        if (uVar3 == '\x1d') {
          uVar3 = visuals_flicker_get_attr_for_frame(selection_attr,(ulong)flicker);
        }
        if (uVar3 == '\x1d') {
          uVar3 = selection_attr;
        }
      }
      mon->attr = uVar3;
      puVar1 = &player->upkeep->redraw;
      *puVar1 = *puVar1 | 0x410000;
    }
LAB_001b5224:
    idx = idx + L'\x01';
  } while( true );
}

Assistant:

static void do_animation(void)
{
	int i;

	for (i = 1; i < cave_monster_max(cave); i++) {
		uint8_t attr;
		struct monster *mon = cave_monster(cave, i);

		if (!mon || !mon->race || !monster_is_visible(mon))
			continue;
		else if (rf_has(mon->race->flags, RF_ATTR_MULTI))
			attr = randint1(BASIC_COLORS - 1);
		else if (rf_has(mon->race->flags, RF_ATTR_FLICKER)) {
			uint8_t base_attr = monster_x_attr[mon->race->ridx];

			/* Get the color cycled attribute, if available. */
			attr = visuals_cycler_get_attr_for_race(mon->race, flicker);

			if (attr == BASIC_COLORS) {
				/* Fall back to the flicker attribute. */
				attr = visuals_flicker_get_attr_for_frame(base_attr, flicker);
			}

			if (attr == BASIC_COLORS) {
				/* Fall back to the static attribute if cycling fails. */
				attr = base_attr;
			}
		}
		else
			continue;

		mon->attr = attr;
		player->upkeep->redraw |= (PR_MAP | PR_MONLIST);
	}

	flicker++;
}